

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O0

Vec_Int_t * Gia_VtaConvertFromGla(Gia_Man_t *p,Vec_Int_t *vGla,int nFrames)

{
  uint n;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int local_48;
  int nGlaSize;
  int Counter;
  int Entry;
  int j;
  int k;
  int i;
  int nObjs;
  int nObjMask;
  int nObjBits;
  Vec_Int_t *vVta;
  int nFrames_local;
  Vec_Int_t *vGla_local;
  Gia_Man_t *p_local;
  
  n = Gia_ManObjNum(p);
  iVar1 = Vec_IntSum(vGla);
  iVar2 = Abc_Base2Log(n);
  iVar3 = Abc_Base2Log(n);
  if ((1 << ((byte)iVar3 & 0x1f)) + -1 < (int)n) {
    __assert_fail("nObjs <= nObjMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absUtil.c"
                  ,0x79,"Vec_Int_t *Gia_VtaConvertFromGla(Gia_Man_t *, Vec_Int_t *, int)");
  }
  p_00 = Vec_IntAlloc(1000);
  Vec_IntPush(p_00,nFrames);
  local_48 = nFrames + 2;
  j = 0;
  while (j <= nFrames) {
    Vec_IntPush(p_00,local_48);
    j = j + 1;
    local_48 = j * iVar1 + local_48;
  }
  for (j = 0; j < nFrames; j = j + 1) {
    for (Entry = 0; Entry <= j; Entry = Entry + 1) {
      for (Counter = 0; iVar1 = Vec_IntSize(vGla), Counter < iVar1; Counter = Counter + 1) {
        iVar1 = Vec_IntEntry(vGla,Counter);
        if (iVar1 != 0) {
          Vec_IntPush(p_00,Entry << ((byte)iVar2 & 0x1f) | Counter);
        }
      }
    }
  }
  Vec_IntEntry(p_00,nFrames + 1);
  iVar1 = Vec_IntEntry(p_00,nFrames + 1);
  iVar2 = Vec_IntSize(p_00);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absUtil.c"
                  ,0x86,"Vec_Int_t *Gia_VtaConvertFromGla(Gia_Man_t *, Vec_Int_t *, int)");
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_VtaConvertFromGla( Gia_Man_t * p, Vec_Int_t * vGla, int nFrames )
{
    Vec_Int_t * vVta;
    int nObjBits, nObjMask, nObjs = Gia_ManObjNum(p);
    int i, k, j, Entry, Counter, nGlaSize;
    //. get the GLA size
    nGlaSize = Vec_IntSum(vGla);
    // get the bitmask
    nObjBits = Abc_Base2Log(nObjs);
    nObjMask = (1 << Abc_Base2Log(nObjs)) - 1;
    assert( nObjs <= nObjMask );
    // go through objects
    vVta = Vec_IntAlloc( 1000 );
    Vec_IntPush( vVta, nFrames );
    Counter = nFrames + 2;
    for ( i = 0; i <= nFrames; i++, Counter += i * nGlaSize )
        Vec_IntPush( vVta, Counter );
    for ( i = 0; i < nFrames; i++ )
        for ( k = 0; k <= i; k++ )
            Vec_IntForEachEntry( vGla, Entry, j )
                if ( Entry ) 
                    Vec_IntPush( vVta, (k << nObjBits) | j );
    Counter = Vec_IntEntry(vVta, nFrames+1);
    assert( Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta) );
    return vVta;
}